

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_connection.h
# Opt level: O3

void __thiscall
blcl::net::connection<MsgType>::add_to_incoming_messages_queue(connection<MsgType> *this)

{
  tsqueue<blcl::net::owned_message<MsgType>_> *this_00;
  transfer_all_t local_59;
  owned_message<MsgType> local_58;
  anon_class_8_1_8991fb9c_for_handler_ local_28;
  socket *local_20;
  
  this_00 = this->incoming_messages_;
  if (this->owner_type_ == server) {
    std::__shared_ptr<blcl::net::connection<MsgType>,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<blcl::net::connection<MsgType>,void>
              ((__shared_ptr<blcl::net::connection<MsgType>,(__gnu_cxx::_Lock_policy)2> *)&local_58,
               (__weak_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<blcl::net::connection<MsgType>_>);
    local_58.msg.header = (this->current_incoming_message_).header;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_58.msg.body,&(this->current_incoming_message_).body);
    tsqueue<blcl::net::owned_message<MsgType>_>::push_back(this_00,&local_58);
  }
  else {
    local_58.remote.super___shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_58.remote.super___shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_58.msg.header = (this->current_incoming_message_).header;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_58.msg.body,&(this->current_incoming_message_).body);
    tsqueue<blcl::net::owned_message<MsgType>_>::push_back(this_00,&local_58);
  }
  if (local_58.msg.body.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.msg.body.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.msg.body.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.msg.body.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_58.remote.super___shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.remote.
               super___shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_20 = &this->socket_;
  local_58.remote.super___shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)&this->current_incoming_message_;
  local_58.remote.super___shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x8;
  local_28.this = this;
  asio::detail::
  initiate_async_read_buffer_sequence<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>
  ::operator()((initiate_async_read_buffer_sequence<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>
                *)&local_20,&local_28,(mutable_buffers_1 *)&local_58,&local_59);
  return;
}

Assistant:

void add_to_incoming_messages_queue() {
            if (owner_type_ == owner::server)
                incoming_messages_.push_back({ this->shared_from_this(), current_incoming_message_ });
            else
                incoming_messages_.push_back({ nullptr, current_incoming_message_ });

            read_header();
        }